

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_execution_limitations.cpp
# Opt level: O3

spv_result_t spvtools::val::ValidateExecutionLimitations(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar3;
  _Rb_tree_node_base *p_Var4;
  Function *entry_point;
  uint *puVar5;
  spv_result_t sVar6;
  uint32_t id;
  ulong uVar7;
  string reason;
  spv_result_t local_28c;
  string local_288;
  ulong local_268;
  Function *local_260;
  string local_258;
  string local_238;
  uint *local_218;
  uint *local_210;
  DiagnosticStream local_208;
  
  sVar6 = SPV_SUCCESS;
  if ((inst->inst_).opcode == 0x36) {
    local_260 = ValidationState_t::function(_,(inst->inst_).result_id);
    if (local_260 == (Function *)0x0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Internal error: missing function id ",0x24);
LAB_0017d4b0:
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
      DiagnosticStream::~DiagnosticStream(&local_208);
      sVar6 = local_208.error_;
    }
    else {
      pvVar2 = ValidationState_t::FunctionEntryPoints(_,(inst->inst_).result_id);
      puVar5 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_218 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      sVar6 = SPV_SUCCESS;
      if (puVar5 != local_218) {
        do {
          uVar7 = (ulong)*puVar5;
          psVar3 = ValidationState_t::GetExecutionModels(_,*puVar5);
          local_268 = uVar7;
          local_210 = puVar5;
          if (psVar3 != (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                         *)0x0) {
            if ((psVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Internal error: empty execution models for function id ",0x37);
              goto LAB_0017d4b0;
            }
            for (p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
                p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              local_288._M_string_length = 0;
              local_288.field_2._M_local_buf[0] = '\0';
              bVar1 = Function::IsCompatibleWithExecutionModel
                                (local_260,p_Var4[1]._M_color,&local_288);
              if (!bVar1) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"OpEntryPoint Entry Point <id> ",0x1e);
                ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(uint32_t)local_268);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"s callgraph contains function <id> ",0x23);
                ValidationState_t::getIdName_abi_cxx11_(&local_258,_,(inst->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_258._M_dataplus._M_p,
                           local_258._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           ", which cannot be used with the current execution model:\n",0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_288._M_dataplus._M_p,
                           local_288._M_string_length);
                local_28c = local_208.error_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                DiagnosticStream::~DiagnosticStream(&local_208);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                         local_288.field_2._M_local_buf[0]) + 1);
              }
              if (!bVar1) {
                return local_28c;
              }
            }
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          id = (uint32_t)local_268;
          entry_point = ValidationState_t::function(_,id);
          bVar1 = Function::CheckLimitations(local_260,_,entry_point,&local_288);
          if (!bVar1) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpEntryPoint Entry Point <id> ",0x1e);
            ValidationState_t::getIdName_abi_cxx11_(&local_238,_,id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"s callgraph contains function <id> ",0x23);
            ValidationState_t::getIdName_abi_cxx11_(&local_258,_,(inst->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       ", which cannot be used with the current execution modes:\n",0x39);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length);
            local_28c = local_208.error_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream(&local_208);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar1) {
            return local_28c;
          }
          puVar5 = local_210 + 1;
        } while (puVar5 != local_218);
        sVar6 = SPV_SUCCESS;
      }
    }
  }
  return sVar6;
}

Assistant:

spv_result_t ValidateExecutionLimitations(ValidationState_t& _,
                                          const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunction) {
    return SPV_SUCCESS;
  }

  const auto func = _.function(inst->id());
  if (!func) {
    return _.diag(SPV_ERROR_INTERNAL, inst)
           << "Internal error: missing function id " << inst->id() << ".";
  }

  for (uint32_t entry_id : _.FunctionEntryPoints(inst->id())) {
    const auto* models = _.GetExecutionModels(entry_id);
    if (models) {
      if (models->empty()) {
        return _.diag(SPV_ERROR_INTERNAL, inst)
               << "Internal error: empty execution models for function id "
               << entry_id << ".";
      }
      for (const auto model : *models) {
        std::string reason;
        if (!func->IsCompatibleWithExecutionModel(model, &reason)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
                 << "s callgraph contains function <id> "
                 << _.getIdName(inst->id())
                 << ", which cannot be used with the current execution "
                    "model:\n"
                 << reason;
        }
      }
    }

    std::string reason;
    if (!func->CheckLimitations(_, _.function(entry_id), &reason)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
             << "s callgraph contains function <id> " << _.getIdName(inst->id())
             << ", which cannot be used with the current execution "
                "modes:\n"
             << reason;
    }
  }
  return SPV_SUCCESS;
}